

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void fmt::v5::vprint_rgb(rgb fd,string_view format,format_args args)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  char escape_fd [20];
  ulong local_48;
  ulong uStack_40;
  uint local_38;
  
  uVar2 = fd._0_2_ & 0xff;
  local_48 = CONCAT17((char)(uVar2 / 100),0x3b323b38335b1b) | 0x3000000000000000;
  uVar3 = fd._1_2_ & 0xff;
  bVar1 = fd.b;
  uStack_40 = CONCAT17(bVar1 / 100,
                       (int7)CONCAT26(0x303b,CONCAT15((char)(uVar3 % 10),
                                                      CONCAT14((char)((uVar3 / 10) % 10),
                                                               CONCAT13((char)(uVar3 / 100),
                                                                        (int3)CONCAT62(
                                                  0x303b3030303b,
                                                  CONCAT11((char)(uVar2 % 10),
                                                           (char)((uVar2 / 10) % 10)) | 0x30)))) |
                                             0x3030003000)) | 0x3000300000000000;
  local_38 = CONCAT22(0x6d,CONCAT11(bVar1 % 10,(char)((ushort)(bVar1 / 10) % 10)) | 0x30) | 0x3000;
  fputs((char *)&local_48,_stdout);
  vprint(format,args);
  fputs("\x1b[0m",_stdout);
  return;
}

Assistant:

FMT_FUNC void vprint_rgb(rgb fd, string_view format, format_args args) {
  char escape_fd[] = "\x1b[38;2;000;000;000m";
  internal::to_esc(fd.r, escape_fd, 7);
  internal::to_esc(fd.g, escape_fd, 11);
  internal::to_esc(fd.b, escape_fd, 15);

  std::fputs(escape_fd, stdout);
  vprint(format, args);
  std::fputs(internal::data::RESET_COLOR, stdout);
}